

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::Copy(aiMaterial **_dest,aiMaterial *src)

{
  uint uVar1;
  uint uVar2;
  aiMaterialProperty *paVar3;
  aiMaterial *this;
  aiMaterialProperty **ppaVar4;
  aiMaterialProperty *paVar5;
  char *__dest;
  ulong uVar6;
  
  if (src != (aiMaterial *)0x0 && _dest != (aiMaterial **)0x0) {
    this = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this);
    *_dest = this;
    aiMaterial::Clear(this);
    if (this->mProperties != (aiMaterialProperty **)0x0) {
      operator_delete__(this->mProperties);
    }
    uVar1 = src->mNumAllocated;
    this->mNumAllocated = uVar1;
    uVar2 = src->mNumProperties;
    this->mNumProperties = uVar2;
    ppaVar4 = (aiMaterialProperty **)operator_new__((ulong)uVar1 << 3);
    this->mProperties = ppaVar4;
    if (uVar2 != 0) {
      uVar6 = 0;
      do {
        paVar5 = (aiMaterialProperty *)operator_new(0x420);
        (paVar5->mKey).length = 0;
        (paVar5->mKey).data[0] = '\0';
        memset((paVar5->mKey).data + 1,0x1b,0x3ff);
        paVar5->mSemantic = 0;
        paVar5->mIndex = 0;
        paVar5->mDataLength = 0;
        paVar5->mType = aiPTI_Float;
        paVar5->mData = (char *)0x0;
        this->mProperties[uVar6] = paVar5;
        paVar3 = src->mProperties[uVar6];
        uVar1 = paVar3->mDataLength;
        paVar5->mDataLength = uVar1;
        __dest = (char *)operator_new__((ulong)uVar1);
        paVar5->mData = __dest;
        memcpy(__dest,paVar3->mData,(ulong)uVar1);
        paVar5->mIndex = paVar3->mIndex;
        paVar5->mSemantic = paVar3->mSemantic;
        if (paVar5 != paVar3) {
          uVar1 = (paVar3->mKey).length;
          (paVar5->mKey).length = uVar1;
          memcpy((paVar5->mKey).data,(paVar3->mKey).data,(ulong)uVar1);
          (paVar5->mKey).data[uVar1] = '\0';
        }
        paVar5->mType = paVar3->mType;
        uVar6 = uVar6 + 1;
      } while (uVar6 < this->mNumProperties);
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy (aiMaterial** _dest, const aiMaterial* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiMaterial* dest = (aiMaterial*) ( *_dest = new aiMaterial() );

    dest->Clear();
    delete[] dest->mProperties;

    dest->mNumAllocated  =  src->mNumAllocated;
    dest->mNumProperties =  src->mNumProperties;
    dest->mProperties    =  new aiMaterialProperty* [dest->mNumAllocated];

    for (unsigned int i = 0; i < dest->mNumProperties;++i)
    {
        aiMaterialProperty* prop  = dest->mProperties[i] = new aiMaterialProperty();
        aiMaterialProperty* sprop = src->mProperties[i];

        prop->mDataLength = sprop->mDataLength;
        prop->mData = new char[prop->mDataLength];
        ::memcpy(prop->mData,sprop->mData,prop->mDataLength);

        prop->mIndex    = sprop->mIndex;
        prop->mSemantic = sprop->mSemantic;
        prop->mKey      = sprop->mKey;
        prop->mType     = sprop->mType;
    }
}